

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

ContentEncoding * __thiscall
mkvparser::Track::GetContentEncodingByIndex(Track *this,unsigned_long idx)

{
  ulong uVar1;
  
  uVar1 = (long)this->content_encoding_entries_end_ - (long)this->content_encoding_entries_ >> 3;
  if ((long)uVar1 < 0) {
    __assert_fail("count >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RainwayApp[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x132d,
                  "const ContentEncoding *mkvparser::Track::GetContentEncodingByIndex(unsigned long) const"
                 );
  }
  if (idx < uVar1) {
    return this->content_encoding_entries_[idx];
  }
  return (ContentEncoding *)0x0;
}

Assistant:

const ContentEncoding* Track::GetContentEncodingByIndex(
    unsigned long idx) const {
  const ptrdiff_t count =
      content_encoding_entries_end_ - content_encoding_entries_;
  assert(count >= 0);

  if (idx >= static_cast<unsigned long>(count))
    return NULL;

  return content_encoding_entries_[idx];
}